

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_signal.cc
# Opt level: O0

void __thiscall flyd::Signal::AddSingal(Signal *this,int signo,SigFunction sighandler)

{
  SourceFile file;
  int iVar1;
  LogStream *this_00;
  _union_1457 in_RDX;
  int in_ESI;
  pair<std::__detail::_Node_iterator<std::pair<const_int,_void_(*)(int,_siginfo_t_*,_void_*)>,_false,_false>,_bool>
  pVar2;
  sigaction sa;
  LogLevel in_stack_ffffffffffffef18;
  int in_stack_ffffffffffffef1c;
  Logger *in_stack_ffffffffffffef20;
  value_type *in_stack_ffffffffffffef28;
  Logger *this_01;
  SourceFile *in_stack_ffffffffffffef30;
  Logger *in_stack_ffffffffffffef50;
  Logger local_10a8;
  _Node_iterator_base<std::pair<const_int,_void_(*)(int,_siginfo_t_*,_void_*)>,_false> local_d0;
  undefined1 local_c8;
  pair<const_int,_void_(*)(int,_siginfo_t_*,_void_*)> local_c0;
  _union_1457 local_b0;
  sigset_t sStack_a8;
  undefined4 local_28;
  _union_1457 local_18;
  int local_c [3];
  
  local_18 = in_RDX;
  local_c[0] = in_ESI;
  std::pair<const_int,_void_(*)(int,_siginfo_t_*,_void_*)>::
  pair<int_&,_void_(*&)(int,_siginfo_t_*,_void_*),_true>
            (&local_c0,local_c,(_func_void_int_siginfo_t_ptr_void_ptr **)&local_18.sa_handler);
  pVar2 = std::
          unordered_map<int,_void_(*)(int,_siginfo_t_*,_void_*),_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_void_(*)(int,_siginfo_t_*,_void_*)>_>_>
          ::insert((unordered_map<int,_void_(*)(int,_siginfo_t_*,_void_*),_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_void_(*)(int,_siginfo_t_*,_void_*)>_>_>
                    *)in_stack_ffffffffffffef30,in_stack_ffffffffffffef28);
  local_d0._M_cur =
       (__node_type *)
       pVar2.first.
       super__Node_iterator_base<std::pair<const_int,_void_(*)(int,_siginfo_t_*,_void_*)>,_false>.
       _M_cur;
  local_c8 = pVar2.second;
  local_b0 = local_18;
  local_28 = 4;
  sigemptyset(&sStack_a8);
  iVar1 = sigaction(local_c[0],(sigaction *)&local_b0,(sigaction *)0x0);
  if (iVar1 < 0) {
    muduo::Logger::SourceFile::SourceFile<103>
              (in_stack_ffffffffffffef30,(char (*) [103])in_stack_ffffffffffffef28);
    this_01 = &local_10a8;
    file._8_8_ = in_stack_ffffffffffffef30;
    file.data_ = (char *)this_01;
    muduo::Logger::Logger
              (in_stack_ffffffffffffef20,file,in_stack_ffffffffffffef1c,in_stack_ffffffffffffef18);
    this_00 = muduo::Logger::stream(this_01);
    muduo::LogStream::operator<<((LogStream *)in_stack_ffffffffffffef20,in_stack_ffffffffffffef1c);
    muduo::LogStream::operator<<(this_00,(char *)this_01);
    muduo::Logger::~Logger(in_stack_ffffffffffffef50);
  }
  return;
}

Assistant:

void flyd::Signal::AddSingal(int signo, SigFunction sighandler)
{
    struct sigaction sa;// 定义一个管理信号的结构体
    signals_.insert({signo, sighandler});
    sa.sa_sigaction = sighandler;
    sa.sa_flags = SA_SIGINFO;//令sa_sigaction指定的信号处理程序生效
    sigemptyset(&sa.sa_mask);
    if( sigaction(signo, &sa, NULL) < 0)
        LOG_ERROR << signo << "信号注册失败\n";
}